

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestCaseStart(StreamingListener *this,TestCase *test_case)

{
  char *pcVar1;
  String local_48;
  string local_38;
  TestCase *local_18;
  TestCase *test_case_local;
  StreamingListener *this_local;
  
  local_18 = test_case;
  test_case_local = (TestCase *)this;
  pcVar1 = TestCase::name(test_case);
  String::Format(&local_48,"event=TestCaseStart&name=%s\n",pcVar1);
  String::operator_cast_to_string(&local_38,&local_48);
  Send(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  String::~String(&local_48);
  return;
}

Assistant:

void OnTestCaseStart(const TestCase& test_case) {
    Send(String::Format("event=TestCaseStart&name=%s\n", test_case.name()));
  }